

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

double __thiscall CGL::Matrix3x3::det(Matrix3x3 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double *pdVar16;
  double dVar17;
  Matrix3x3 *A;
  undefined8 in_stack_ffffffffffffff68;
  Matrix3x3 *in_stack_ffffffffffffff70;
  Matrix3x3 *this_00;
  
  pdVar16 = operator()(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                       (int)in_stack_ffffffffffffff68);
  dVar17 = -*pdVar16;
  pdVar16 = operator()(in_stack_ffffffffffffff70,(int)((ulong)dVar17 >> 0x20),SUB84(*pdVar16,0));
  dVar14 = dVar17 * *pdVar16;
  pdVar16 = operator()(in_stack_ffffffffffffff70,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar1 = *pdVar16;
  pdVar16 = operator()(in_stack_ffffffffffffff70,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  this_00 = (Matrix3x3 *)*pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar15 = (double)this_00 * *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,(int)((ulong)dVar17 >> 0x20),SUB84(dVar17,0));
  return dVar12 * dVar13 * *pdVar16 +
         -(dVar9 * dVar10) * dVar11 +
         -(dVar6 * dVar7) * dVar8 + dVar3 * dVar4 * dVar5 + dVar14 * dVar1 + dVar15 * dVar2;
}

Assistant:

double Matrix3x3::det( void ) const {
    const Matrix3x3& A( *this );

    return -A(0,2)*A(1,1)*A(2,0) + A(0,1)*A(1,2)*A(2,0) +
            A(0,2)*A(1,0)*A(2,1) - A(0,0)*A(1,2)*A(2,1) -
            A(0,1)*A(1,0)*A(2,2) + A(0,0)*A(1,1)*A(2,2) ;
  }